

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O1

int __thiscall clunk::Node::QSearch<true>(Node *this,int alpha,int beta,int depth)

{
  HashEntry *this_00;
  Move MVar1;
  Node *pNVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  Move *pMVar9;
  Move *pMVar10;
  uint uVar11;
  Move *pMVar12;
  int iVar13;
  Move *this_01;
  int iVar14;
  int iVar15;
  
  if (beta <= alpha) {
    __assert_fail("alpha < beta",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xeff,"int clunk::Node::QSearch(int, int, const int) [color = true]");
  }
  uVar4 = -alpha;
  if (0 < alpha) {
    uVar4 = alpha;
  }
  if (32000 < uVar4) {
    __assert_fail("abs(alpha) <= Infinity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf00,"int clunk::Node::QSearch(int, int, const int) [color = true]");
  }
  uVar4 = -beta;
  if (0 < beta) {
    uVar4 = beta;
  }
  if (32000 < uVar4) {
    __assert_fail("abs(beta) <= Infinity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf01,"int clunk::Node::QSearch(int, int, const int) [color = true]");
  }
  if (0 < depth) {
    __assert_fail("depth <= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf02,"int clunk::Node::QSearch(int, int, const int) [color = true]");
  }
  _stats._56_8_ = _stats._56_8_ + 1;
  if (_seldepth < this->ply) {
    _seldepth = this->ply;
  }
  this->depthChange = 0;
  this->pvCount = 0;
  if ((99 < this->rcount || (this->state & 0x20U) != 0) || (bVar3 = HasRepeated(this), bVar3)) {
switchD_00135b8e_caseD_2:
    iVar14 = DAT_0017ea54;
    this->standPat = DAT_0017ea54;
  }
  else {
    iVar5 = this->ply;
    iVar14 = iVar5 + -32000;
    if (alpha < iVar14) {
      alpha = iVar14;
    }
    iVar13 = 0x7d01 - iVar5;
    if (beta <= 0x7d01 - iVar5) {
      iVar13 = beta;
    }
    if (this->child == (Node *)0x0 || iVar13 <= alpha) {
      return alpha;
    }
    if (DAT_0017fcd0 == 0) {
      __assert_fail("keyMask",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/HashTable.h"
                    ,0xf7,
                    "EntryType *clunk::TranspositionTable<clunk::HashEntry>::Get(const uint64_t) [EntryType = clunk::HashEntry]"
                   );
    }
    if (DAT_0017fcd8 == 0) {
      __assert_fail("entries",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/HashTable.h"
                    ,0xf8,
                    "EntryType *clunk::TranspositionTable<clunk::HashEntry>::Get(const uint64_t) [EntryType = clunk::HashEntry]"
                   );
    }
    _tt = _tt + 1;
    lVar7 = (DAT_0017fcd0 & this->positionKey) * 0x10;
    this_00 = (HashEntry *)(DAT_0017fcd8 + lVar7);
    if (*(ulong *)(DAT_0017fcd8 + lVar7) == this->positionKey) {
      DAT_0017fcb8 = DAT_0017fcb8 + 1;
      switch(this_00->flags & 7) {
      case 1:
        goto switchD_00135b8e_caseD_1;
      case 2:
        goto switchD_00135b8e_caseD_2;
      case 3:
        iVar5 = HashEntry::Score(this_00,iVar5);
        if (iVar5 <= alpha) {
          return iVar5;
        }
        break;
      case 4:
        iVar14 = HashEntry::Score(this_00,iVar5);
        return iVar14;
      case 5:
        iVar5 = HashEntry::Score(this_00,iVar5);
        if (iVar13 <= iVar5) {
          return iVar5;
        }
        break;
      default:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xf2d,"int clunk::Node::QSearch(int, int, const int) [color = true]");
      }
    }
    if (iVar13 <= alpha) {
      __assert_fail("alpha < beta",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xf32,"int clunk::Node::QSearch(int, int, const int) [color = true]");
    }
    if (this->pvCount != 0) {
      __assert_fail("!pvCount",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xf33,"int clunk::Node::QSearch(int, int, const int) [color = true]");
    }
    iVar5 = alpha;
    if (this->checks == 0) {
      Evaluate(this);
      iVar14 = this->standPat;
      if (iVar13 <= iVar14) {
        return iVar14;
      }
      iVar5 = iVar14;
      if (iVar14 < alpha) {
        iVar5 = alpha;
      }
      if (iVar13 <= alpha) {
        __assert_fail("alpha < beta",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xf3e,"int clunk::Node::QSearch(int, int, const int) [color = true]");
      }
    }
    GenerateMoves<true,true>(this,depth);
    if (this->moveCount < 1) {
      if (this->checks == 0) {
        iVar14 = this->standPat;
      }
      else {
        if (this->positionKey == 0) {
          __assert_fail("entryKey",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/HashTable.h"
                        ,0x7b,"void clunk::HashEntry::SetCheckmate(const uint64_t)");
        }
        this_00->key = this->positionKey;
        this_00->moveBits = 0;
        this_00->depth = '\0';
        this_00->flags = '\x01';
        this_00->score = 32000;
        DAT_0017fcc0 = DAT_0017fcc0 + 1;
        iVar14 = this->ply + -32000;
      }
    }
    else {
      while( true ) {
        iVar6 = this->moveIndex;
        lVar7 = (long)iVar6;
        if (lVar7 < 0) {
          __assert_fail("moveIndex >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x914,"Move *clunk::Node::GetNextMove()");
        }
        uVar4 = this->moveCount;
        if (0x7f < uVar4) {
          __assert_fail("(moveCount >= 0) & (moveCount < MaxMoves)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x915,"Move *clunk::Node::GetNextMove()");
        }
        if (iVar6 < (int)uVar4) {
          this_01 = this->moves + lVar7;
          uVar8 = iVar6 + 1;
          pMVar9 = this_01;
          if ((int)uVar8 < (int)uVar4) {
            pMVar10 = this->moves + uVar8;
            pMVar12 = this_01;
            uVar11 = uVar8;
            do {
              pMVar9 = pMVar10;
              if (pMVar10->score <= pMVar12->score) {
                pMVar9 = pMVar12;
              }
              uVar11 = uVar11 + 1;
              pMVar10 = pMVar10 + 1;
              pMVar12 = pMVar9;
            } while ((int)uVar11 < (int)uVar4);
          }
          if (pMVar9 != this_01) {
            MVar1 = this->moves[lVar7];
            this->moves[lVar7].bits = pMVar9->bits;
            this->moves[lVar7].score = pMVar9->score;
            *pMVar9 = MVar1;
          }
          this->moveIndex = uVar8;
        }
        else {
          this_01 = (Move *)0x0;
        }
        if (this_01 == (Move *)0x0) break;
        bVar3 = Move::IsValid(this_01);
        if (!bVar3) {
          __assert_fail("move->IsValid()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0xf50,"int clunk::Node::QSearch(int, int, const int) [color = true]");
        }
        if (iVar5 < iVar14) {
          __assert_fail("best <= alpha",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0xf51,"int clunk::Node::QSearch(int, int, const int) [color = true]");
        }
        if (iVar13 <= iVar5) {
          __assert_fail("alpha < beta",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0xf52,"int clunk::Node::QSearch(int, int, const int) [color = true]");
        }
        _stats._96_8_ = _stats._96_8_ + 1;
        Exec<true>(this,this_01,this->child);
        iVar6 = QSearch<false>(this->child,-iVar13,-iVar5,depth + -1);
        Undo<true>(this,this_01);
        if (_stop != 0) {
          return iVar13;
        }
        iVar15 = -iVar6;
        if (SBORROW4(iVar14,iVar15) != iVar14 + iVar6 < 0) {
          Move::operator=(this->pv,this_01);
          pNVar2 = this->child;
          if (pNVar2 == (Node *)0x0) {
            this->pvCount = 1;
          }
          else {
            iVar14 = pNVar2->pvCount;
            this->pvCount = iVar14 + 1;
            if (0 < iVar14) {
              if (99 < iVar14) {
                __assert_fail("pvCount <= MaxPlies",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                              ,0xc50,"void clunk::Node::UpdatePV(const Move &)");
              }
              memcpy(this->pv + 1,pNVar2->pv,(long)pNVar2->pvCount << 3);
            }
          }
          if (iVar13 == iVar15 || SBORROW4(iVar13,iVar15) != iVar13 + iVar6 < 0) {
            return iVar15;
          }
          iVar14 = iVar15;
          if (iVar5 == iVar15 || SBORROW4(iVar5,iVar15) != iVar5 + iVar6 < 0) {
            iVar5 = iVar15;
          }
        }
        if (iVar13 <= iVar5) {
          __assert_fail("alpha < beta",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0xf62,"int clunk::Node::QSearch(int, int, const int) [color = true]");
        }
      }
      if (iVar5 < iVar14) {
        __assert_fail("best <= alpha",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xf65,"int clunk::Node::QSearch(int, int, const int) [color = true]");
      }
      if (iVar13 <= iVar5) {
        __assert_fail("alpha < beta",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xf66,"int clunk::Node::QSearch(int, int, const int) [color = true]");
      }
    }
  }
switchD_00135b8e_caseD_1:
  return iVar14;
}

Assistant:

int QSearch(int alpha, int beta, const int depth) {
    assert(alpha < beta);
    assert(abs(alpha) <= Infinity);
    assert(abs(beta) <= Infinity);
    assert(depth <= 0);

    _stats.qnodes++;
    if (ply > _seldepth) {
      _seldepth = ply;
    }

    pvCount = 0;
    depthChange = 0;

    if (IsDraw()) {
      return (standPat = _drawScore[color]);
    }

    // mate distance pruning
    int best = (ply - Infinity);
    alpha = std::max<int>(best, alpha);
    beta = std::min<int>((Infinity - ply + 1), beta);
    if ((alpha >= beta) | !child) {
      return alpha;
    }

    // transposition table lookup
    int score;
    HashEntry* entry = _tt.Get(positionKey);
    if (entry->Key() == positionKey) {
      _tt.IncHits();
      switch (entry->GetPrimaryFlag()) {
      case HashEntry::Checkmate: return (ply - Infinity);
      case HashEntry::Stalemate: return (standPat = _drawScore[color]);
      case HashEntry::UpperBound:
        if ((score = entry->Score(ply)) <= alpha) {
          return score;
        }
        break;
      case HashEntry::ExactScore:
        return entry->Score(ply);
      case HashEntry::LowerBound:
        if ((score = entry->Score(ply)) >= beta) {
          return score;
        }
        break;
      default:
        assert(false);
      }
    }

    assert(best <= alpha);
    assert(alpha < beta);
    assert(!pvCount);

    // if not in check allow standPat
    if (!checks) {
      Evaluate();
      if (standPat >= beta) {
        return standPat;
      }
      alpha = std::max<int>(alpha, standPat);
      best = standPat;
      assert(best <= alpha);
      assert(alpha < beta);
    }

    // generate moves
    GenerateMoves<color, true>(depth);
    if (moveCount <= 0) {
      if (checks) {
        entry->SetCheckmate(positionKey);
        _tt.IncCheckmates();
        return (ply - Infinity);
      }
      // don't call _tt.StoreStalemate()!!!
      return standPat;
    }

    // search 'em
    Move* move;
    while ((move = GetNextMove())) {
      assert(move->IsValid());
      assert(best <= alpha);
      assert(alpha < beta);
      _stats.qexecs++;
      Exec<color>(*move, *child);
      score = -child->QSearch<!color>(-beta, -alpha, (depth - 1));
      Undo<color>(*move);
      if (_stop) {
        return beta;
      }
      if (score > best) {
        UpdatePV(*move);
        if (score >= beta) {
          return score;
        }
        alpha = std::max<int>(alpha, score);
        best = score;
      }
      assert(alpha < beta);
    }

    assert(best <= alpha);
    assert(alpha < beta);
    return best;
  }